

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_int.cc
# Opt level: O2

int asn1_string_set_uint64(ASN1_STRING *out,uint64_t v,int type)

{
  int iVar1;
  uint8_t auVar2 [8];
  long lVar3;
  uint8_t *data;
  uint8_t buf [8];
  
  auVar2 = (uint8_t  [8])
           (v >> 0x38 | (v & 0xff000000000000) >> 0x28 | (v & 0xff0000000000) >> 0x18 |
            (v & 0xff00000000) >> 8 | (v & 0xff000000) << 8 | (v & 0xff0000) << 0x18 |
            (v & 0xff00) << 0x28 | v << 0x38);
  buf[0] = auVar2[0];
  buf[1] = auVar2[1];
  buf[2] = auVar2[2];
  buf[3] = auVar2[3];
  buf[4] = auVar2[4];
  buf[5] = auVar2[5];
  buf[6] = auVar2[6];
  buf[7] = auVar2[7];
  lVar3 = 8;
  for (data = buf; (lVar3 != 0 && (*data == '\0')); data = (uint8_t *)((char *)data + 1)) {
    lVar3 = lVar3 + -1;
  }
  iVar1 = ASN1_STRING_set((ASN1_STRING *)out,data,(int)lVar3);
  if (iVar1 != 0) {
    out->type = type;
  }
  return (uint)(iVar1 != 0);
}

Assistant:

static int asn1_string_set_uint64(ASN1_STRING *out, uint64_t v, int type) {
  uint8_t buf[sizeof(uint64_t)];
  CRYPTO_store_u64_be(buf, v);
  size_t leading_zeros;
  for (leading_zeros = 0; leading_zeros < sizeof(buf); leading_zeros++) {
    if (buf[leading_zeros] != 0) {
      break;
    }
  }

  if (!ASN1_STRING_set(out, buf + leading_zeros, sizeof(buf) - leading_zeros)) {
    return 0;
  }
  out->type = type;
  return 1;
}